

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O0

TPZStructMatrixOT<std::complex<double>_> * __thiscall
TPZStructMatrixOT<std::complex<double>_>::operator=
          (TPZStructMatrixOT<std::complex<double>_> *this,
          TPZStructMatrixOT<std::complex<double>_> *copy)

{
  TPZStrMatParInterface *in_RSI;
  TPZStructMatrixOT<std::complex<double>_> *in_RDI;
  TPZVec<long> *unaff_retaddr;
  TPZStructMatrixOT<std::complex<double>_> *copy_00;
  
  copy_00 = in_RDI;
  TPZStrMatParInterface::operator=(in_RSI,(TPZStrMatParInterface *)in_RDI);
  TPZVec<long>::operator=(unaff_retaddr,(TPZVec<long> *)copy_00);
  TPZVec<long>::operator=(unaff_retaddr,(TPZVec<long> *)copy_00);
  TPZVec<long>::operator=(unaff_retaddr,(TPZVec<long> *)copy_00);
  in_RDI->fElementCompleted = *(int64_t *)&in_RSI[6].fNumThreads;
  return in_RDI;
}

Assistant:

TPZStructMatrixOT<TVar>& TPZStructMatrixOT<TVar>::operator=(const TPZStructMatrixOT &copy){
    TPZStrMatParInterface::operator=(copy);
    fElBlocked = copy.fElBlocked;
    fElSequenceColor = copy.fElSequenceColor;
    fElementsComputed = copy.fElementsComputed;
    fElementCompleted = copy.fElementCompleted;
    //fSomeoneisSleeping //no need
    //fCurrentIndex //no need
    return *this;
}